

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphGenerator.cpp
# Opt level: O2

bool __thiscall
ADS::RandomGraphGenerator::addEdges
          (RandomGraphGenerator *this,Graph<unsigned_int> *pGraph,uint uiNVerteces,uint uiNEdges)

{
  bool bVar1;
  uint uiSrcKey;
  uint uiDstKey;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  if (pGraph != (Graph<unsigned_int> *)0x0) {
    while (pGraph->_uiNEdges < uiNEdges) {
      random();
      random();
      uiSrcKey = (uint)(long)extraout_XMM0_Da;
      uiDstKey = (uint)(long)extraout_XMM0_Da_00;
      if (uiSrcKey != uiDstKey) {
        random();
        bVar1 = Graph<unsigned_int>::hasEdge(pGraph,uiSrcKey,uiDstKey);
        if (!bVar1) {
          Graph<unsigned_int>::addEdge(pGraph,uiSrcKey,uiDstKey,(uint)(long)extraout_XMM0_Da_01);
        }
      }
    }
  }
  return pGraph != (Graph<unsigned_int> *)0x0;
}

Assistant:

bool RandomGraphGenerator::addEdges (Graph<unsigned int> *pGraph,
                                     unsigned int uiNVerteces,
                                     unsigned int uiNEdges)
{
    if (pGraph == NULL)
        return false;

    while (pGraph->getEdgeCount() < uiNEdges) {
        unsigned int uiSrc = static_cast<unsigned int>(random (uiNVerteces));
        unsigned int uiDst = static_cast<unsigned int>(random (uiNVerteces));
        
        if (uiSrc == uiDst) {
            /* do not add edges to itself */
            continue;
        }

        unsigned int uiCost = random (EDGE_MIN_COST, EDGE_MAX_COST);

        if (!pGraph->hasEdge (uiSrc, uiDst))
            pGraph-> addEdge (uiSrc, uiDst, uiCost);
    }

    return true;
}